

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastUInt64ToBufferLeft(protobuf *this,uint64 u64,char *buffer)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  LogMessage *other;
  uint uVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((ulong)this >> 0x20 == 0) {
    pcVar3 = FastUInt32ToBufferLeft((protobuf *)((ulong)this & 0xffffffff),(uint32)u64,buffer);
    return pcVar3;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  pcVar3 = FastUInt64ToBufferLeft
                     (SUB168(auVar2 / ZEXT816(1000000000),0),u64,(char *)((ulong)this % 1000000000))
  ;
  uVar4 = (int)this + SUB164(auVar2 / ZEXT816(1000000000),0) * -1000000000;
  if (999999999 < uVar4) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x42c);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (digits) < (100): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  *(undefined2 *)pcVar3 = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar4 / 10000000) * 2);
  uVar4 = (int)((ulong)uVar4 / 10000000) * -10000000 + uVar4;
  uVar1 = (ulong)uVar4 / 100000;
  *(undefined2 *)(pcVar3 + 2) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  uVar4 = (int)uVar1 * -100000 + uVar4;
  uVar1 = (ulong)uVar4 / 1000;
  *(undefined2 *)(pcVar3 + 4) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  uVar4 = (int)uVar1 * -1000 + uVar4;
  uVar1 = (ulong)uVar4 / 10;
  *(undefined2 *)(pcVar3 + 6) = *(undefined2 *)(two_ASCII_digits + uVar1 * 2);
  pcVar3[8] = (char)uVar1 * -10 + (char)uVar4 + '0';
  pcVar3[9] = '\0';
  return pcVar3 + 9;
}

Assistant:

char* FastUInt64ToBufferLeft(uint64 u64, char* buffer) {
  int digits;
  const char *ASCII_digits = nullptr;

  uint32 u = static_cast<uint32>(u64);
  if (u == u64) return FastUInt32ToBufferLeft(u, buffer);

  uint64 top_11_digits = u64 / 1000000000;
  buffer = FastUInt64ToBufferLeft(top_11_digits, buffer);
  u = u64 - (top_11_digits * 1000000000);

  digits = u / 10000000;  // 10,000,000
  GOOGLE_DCHECK_LT(digits, 100);
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10000000;  // 10,000,000
  digits = u / 100000;  // 100,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 100000;  // 100,000
  digits = u / 1000;  // 1,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 1000;  // 1,000
  digits = u / 10;
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10;
  digits = u;
  *buffer++ = '0' + digits;
  *buffer = 0;
  return buffer;
}